

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  ZSTD_fseCTables_t *nextEntropy_00;
  ZSTD_strategy ZVar1;
  uint uVar2;
  seqDef *sequences;
  seqDef *psVar3;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  bool bVar4;
  size_t err_code;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  uint disableLiteralCompression;
  byte *pbVar8;
  ulong nbSeq;
  bool bVar9;
  ZSTD_symbolEncodingTypeStats_t local_50;
  
  ZVar1 = (cctxParams->cParams).strategy;
  uVar2 = (cctxParams->cParams).windowLog;
  disableLiteralCompression = 0;
  if (cctxParams->literalCompressionMode != ZSTD_lcm_huffman) {
    if (cctxParams->literalCompressionMode == ZSTD_lcm_uncompressed) {
      disableLiteralCompression = 1;
    }
    else if (ZVar1 == ZSTD_fast) {
      disableLiteralCompression = (uint)((cctxParams->cParams).targetLength != 0);
    }
  }
  sequences = seqStorePtr->sequencesStart;
  psVar3 = seqStorePtr->sequences;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  sVar5 = ZSTD_compressLiterals
                    (&prevEntropy->huf,&nextEntropy->huf,ZVar1,disableLiteralCompression,dst,
                     dstCapacity,seqStorePtr->litStart,
                     (long)seqStorePtr->lit - (long)seqStorePtr->litStart,
                     (void *)((long)entropyWorkspace + 0xd4),0x1904,(int)entropyWkspSize);
  sVar6 = sVar5;
  if ((sVar5 < 0xffffffffffffff89) && (sVar6 = 0xffffffffffffffba, 3 < (long)(dstCapacity - sVar5)))
  {
    nbSeq = (long)psVar3 - (long)sequences >> 3;
    pbVar8 = (byte *)(sVar5 + (long)dst);
    if (nbSeq < 0x80) {
      *pbVar8 = (byte)nbSeq;
      pbVar8 = pbVar8 + 1;
    }
    else if (nbSeq < 0x7f00) {
      *pbVar8 = (byte)(nbSeq >> 8) | 0x80;
      pbVar8[1] = (byte)nbSeq;
      pbVar8 = pbVar8 + 2;
    }
    else {
      *pbVar8 = 0xff;
      *(short *)(pbVar8 + 1) = (short)nbSeq + -0x7f00;
      pbVar8 = pbVar8 + 3;
    }
    nextEntropy_00 = &nextEntropy->fse;
    if (psVar3 == sequences) {
      memcpy(nextEntropy_00,&prevEntropy->fse,0xde0);
      sVar6 = (long)pbVar8 - (long)dst;
    }
    else {
      ZSTD_buildSequencesStatistics
                (&local_50,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar8 + 1,
                 (BYTE *)((long)dst + dstCapacity),ZVar1,(uint *)entropyWorkspace,
                 (void *)((long)entropyWorkspace + 0xd4),0x1904);
      sVar6 = local_50.size;
      if (local_50.size < 0xffffffffffffff89) {
        *pbVar8 = (char)(local_50.Offtype << 4) + (char)(local_50.LLtype << 6) +
                  (char)local_50.MLtype * '\x04';
        pbVar8 = pbVar8 + 1 + local_50.size;
        sVar6 = ZSTD_encodeSequences
                          (pbVar8,(long)((long)dst + dstCapacity) - (long)pbVar8,
                           (nextEntropy->fse).matchlengthCTable,mlCodeTable,
                           nextEntropy_00->offcodeCTable,ofCodeTable,
                           (nextEntropy->fse).litlengthCTable,llCodeTable,sequences,nbSeq,
                           (uint)(0x39 < uVar2),(int)entropyWkspSize);
        if (sVar6 < 0xffffffffffffff89) {
          pbVar8 = pbVar8 + sVar6;
          bVar9 = 3 < sVar6 + local_50.lastCountSize;
          bVar4 = bVar9 || local_50.lastCountSize == 0;
          sVar6 = sVar5;
          if (!bVar9 && local_50.lastCountSize != 0) {
            sVar6 = 0;
          }
        }
        else {
          bVar4 = false;
        }
        if (bVar4) {
          sVar6 = (long)pbVar8 - (long)dst;
        }
      }
    }
  }
  if ((sVar6 == 0) || ((srcSize <= dstCapacity && (sVar6 == 0xffffffffffffffba)))) {
    sVar6 = 0;
  }
  else if (sVar6 < 0xffffffffffffff89) {
    ZVar1 = (cctxParams->cParams).strategy;
    bVar7 = 6;
    if (ZSTD_btopt < ZVar1) {
      bVar7 = (char)ZVar1 - 1;
    }
    if ((srcSize - (srcSize >> (bVar7 & 0x3f))) - 2 <= sVar6) {
      sVar6 = 0;
    }
  }
  return sVar6;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(seqStore_t* seqStorePtr,
                       const ZSTD_entropyCTables_t* prevEntropy,
                             ZSTD_entropyCTables_t* nextEntropy,
                       const ZSTD_CCtx_params* cctxParams,
                             void* dst, size_t dstCapacity,
                             size_t srcSize,
                             void* entropyWorkspace, size_t entropyWkspSize,
                             int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity))
        return 0;  /* block not compressed */
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(4, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    return cSize;
}